

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,HashedCharacterBuffer<char16_t> **key,PropertyRecord **value)

{
  Type *pTVar1;
  hash_t hashCode;
  uint uVar2;
  undefined8 *puVar3;
  HashedCharacterBuffer<char16_t> *pHVar4;
  char16_t *string2;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  *pSVar5;
  PropertyRecord *pPVar6;
  int *piVar7;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  *pSVar8;
  code *pcVar9;
  WriteBarrierPtr<const_Js::PropertyRecord> WVar10;
  WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_> WVar11;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_> *addr;
  WriteBarrierPtr<const_Js::PropertyRecord> local_68;
  WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_> local_60;
  PropertyRecord **local_58;
  long local_50;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_48;
  ulong local_40;
  uint local_34;
  
  lVar17 = *(long *)this;
  local_58 = value;
  if (lVar17 == 0) {
    BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar17 = *(long *)this;
  }
  hashCode = *(int *)&((*key)->super_CharacterBuffer<char16_t>).field_0xc * 2 + 1;
  local_40 = CONCAT44(local_40._4_4_,hashCode);
  local_34 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar17 + (ulong)local_34 * 4);
  local_48 = (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar14 < 0) {
    uVar19 = 0;
  }
  else {
    lVar17 = *(long *)(this + 8);
    uVar19 = 0;
    do {
      puVar3 = *(undefined8 **)(lVar17 + 0x10 + (ulong)uVar14 * 0x18);
      pHVar4 = *key;
      if ((*(uint *)(puVar3 + 1) == (pHVar4->super_CharacterBuffer<char16_t>).len) &&
         (*(int *)((long)puVar3 + 0xc) ==
          *(int *)&(pHVar4->super_CharacterBuffer<char16_t>).field_0xc)) {
        string2 = (pHVar4->super_CharacterBuffer<char16_t>).string.ptr;
        if (((char16_t *)*puVar3 == string2) ||
           (iVar15 = PAL_wmemcmp((char16_t *)*puVar3,string2,(ulong)*(uint *)(puVar3 + 1)),
           iVar15 == 0)) {
          if (local_48->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(local_48->stats,uVar19);
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar13 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                              ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
          if (bVar13) {
            *puVar16 = 0;
            return -1;
          }
          goto LAB_007c81b5;
        }
      }
      uVar19 = uVar19 + 1;
      uVar14 = *(uint *)(lVar17 + (ulong)uVar14 * 0x18 + 8);
    } while (-1 < (int)uVar14);
  }
  pBVar12 = local_48;
  if (local_48->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_48->stats,uVar19);
  }
  if (pBVar12->freeCount == 0) {
    uVar14 = pBVar12->size;
    uVar2 = pBVar12->count;
    if (uVar2 == uVar14) {
      BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize(pBVar12);
      local_34 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket((hash_t)local_40,pBVar12->bucketCount,pBVar12->modFunctionIndex);
      uVar14 = pBVar12->size;
      uVar2 = pBVar12->count;
    }
    uVar18 = (ulong)uVar2;
    pBVar12->count = uVar2 + 1;
    if ((int)uVar14 < (int)(uVar2 + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f1,"(count <= size)","count <= size");
      if (!bVar13) goto LAB_007c81b5;
      *puVar16 = 0;
      uVar14 = pBVar12->size;
    }
    if ((int)uVar14 <= (int)uVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f2,"(index < size)","index < size");
      if (!bVar13) goto LAB_007c81b5;
      *puVar16 = 0;
    }
  }
  else {
    if (pBVar12->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar13) goto LAB_007c81b5;
      *puVar16 = 0;
    }
    uVar14 = pBVar12->freeList;
    if ((int)uVar14 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar13) goto LAB_007c81b5;
      *puVar16 = 0;
      uVar14 = pBVar12->freeList;
    }
    if (pBVar12->count <= (int)uVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar13 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar13) {
LAB_007c81b5:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *puVar16 = 0;
      uVar14 = pBVar12->freeList;
    }
    uVar18 = (ulong)uVar14;
    pTVar1 = &pBVar12->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar15 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex((pBVar12->entries).ptr + (int)uVar14);
      pBVar12->freeList = iVar15;
    }
  }
  pSVar5 = (pBVar12->entries).ptr;
  lVar17 = (long)(int)uVar18;
  pSVar8 = pSVar5 + lVar17;
  pHVar4 = *key;
  local_50 = lVar17;
  local_40 = uVar18;
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60.ptr = pHVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  pPVar6 = *local_58;
  Memory::Recycler::WBSetBit((char *)&local_68);
  local_68.ptr = pPVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
  WVar10.ptr = local_68.ptr;
  Memory::Recycler::WBSetBit((char *)pSVar8);
  pSVar5 = pSVar5 + lVar17;
  addr = &(pSVar5->
          super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          ).
          super_KeyValueEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
          .
          super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
          .
          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
          .key;
  (pSVar5->
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).
  super_KeyValueEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
  .
  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  .value.ptr = WVar10.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar8);
  WVar11.ptr = local_60.ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  uVar18 = local_40;
  pBVar12 = local_48;
  addr->ptr = WVar11.ptr;
  iVar15 = (int)local_40;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  piVar7 = (pBVar12->buckets).ptr;
  pSVar8 = (pBVar12->entries).ptr;
  pSVar8[lVar17].
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .
  super_KeyValueEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
  .
  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  .next = piVar7[local_34];
  piVar7[local_34] = (int)local_50;
  uVar19 = 0;
  uVar18 = uVar18 & 0xffffffff;
  do {
    uVar14 = pSVar8[(int)uVar18].
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .
             super_KeyValueEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
             .
             super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
             .
             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
             .next;
    uVar18 = (ulong)uVar14;
    uVar19 = uVar19 + 1;
  } while (uVar14 != 0xffffffff);
  if (pBVar12->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(pBVar12->stats,uVar19);
  }
  return iVar15;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }